

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen-cave.c
# Opt level: O2

chunk_conflict * town_gen(player *p,wchar_t min_height,wchar_t min_width,char **p_error)

{
  ushort uVar1;
  bool bVar2;
  _Bool _Var3;
  uint32_t uVar4;
  uint32_t uVar5;
  wchar_t wVar6;
  wchar_t wVar7;
  wchar_t wVar8;
  wchar_t wVar9;
  wchar_t wVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  chunk_conflict *source;
  chunk *c;
  feature *pfVar14;
  square *psVar15;
  wchar_t extraout_var;
  wchar_t extraout_var_00;
  ulong uVar16;
  loc_conflict lVar17;
  loc lVar18;
  long lVar19;
  int iVar20;
  int iVar21;
  uint uVar22;
  loc grid;
  loc grid_00;
  wchar_t wVar23;
  int iVar24;
  wchar_t wVar25;
  long lVar26;
  loc grid_01;
  ulong unaff_R13;
  loc lVar27;
  int iVar28;
  ulong uVar29;
  bool bVar30;
  long lStackY_120;
  undefined4 uVar31;
  undefined4 in_stack_fffffffffffffeec;
  undefined4 uVar32;
  undefined4 in_stack_fffffffffffffef4;
  wchar_t local_100;
  ulong local_f8;
  ulong local_f0;
  ulong local_e8;
  uint local_e0;
  wchar_t local_d8;
  wchar_t lot_n;
  wchar_t local_c4;
  loc_conflict nw_corner;
  wchar_t local_b8;
  wchar_t lot_e;
  ulong local_b0;
  ulong local_a8;
  ulong local_a0;
  ulong local_98;
  loc local_90;
  loc local_88;
  wchar_t local_80;
  wchar_t local_7c;
  loc local_78;
  uint local_70;
  int local_6c;
  int local_68;
  int local_64;
  ulong local_60;
  loc_conflict local_58;
  player *local_50;
  loc local_48;
  ulong local_40;
  wchar_t local_38;
  int local_34;
  
  _Var3 = is_daytime();
  local_70 = (uint)(&z_info->town_monsters_day)[!_Var3];
  source = chunk_find_name("Town");
  c = (chunk *)cave_new((uint)z_info->town_hgt,(uint)z_info->town_wid);
  local_50 = p;
  if (source == (chunk_conflict *)0x0) {
    c->depth = (int)p->depth;
    uVar4 = Rand_div(3);
    local_7c = (wchar_t)z_info->town_wid;
    lVar18.x = c->height + L'\xffffffff';
    lVar18.y = L'\0';
    draw_rectangle(c,L'\0',L'\0',lVar18.x,c->width + L'\xffffffff',L'\x16',L'\0',true);
    local_34 = uVar4 + 6;
    local_40 = 0;
    if (local_34 < 1) {
      local_34 = 0;
    }
    local_80 = L'\0';
    bVar30 = false;
    local_90 = lVar18;
    local_88 = lVar18;
    local_78 = lVar18;
    local_48 = lVar18;
LAB_001462c4:
    lVar18 = local_78;
    if (!bVar30) {
      lStackY_120 = 1;
      do {
        for (; iVar20 = local_34, lStackY_120 < (long)c->height + -1; lStackY_120 = lStackY_120 + 1)
        {
          for (lVar19 = 1; lVar19 < (long)c->width + -1; lVar19 = lVar19 + 1) {
            square_set_feat((chunk_conflict *)c,(loc)((lStackY_120 << 0x20) + lVar19),L'\x15');
          }
        }
        while (bVar30 = iVar20 != 0, iVar20 = iVar20 + -1, bVar30) {
          build_streamer((chunk_conflict *)c,L'\x17',L'\0');
        }
        uVar32 = 0;
        uVar31 = 1;
        generate_starburst_room
                  (c,L'\0',L'\0',c->height + L'\xffffffff',c->width + L'\xffffffff',false,L'\x01',
                   false);
        lVar27.x = L'\x01';
        lVar27.y = L'\x01';
        for (lVar19 = 1; lVar19 < (long)c->height + -1; lVar19 = lVar19 + 1) {
          lVar18 = lVar27;
          for (lVar26 = 1; lVar26 < (long)c->width + -1; lVar26 = lVar26 + 1) {
            psVar15 = square((chunk_conflict *)c,lVar18);
            flag_off(psVar15->info,3,4);
            lVar18 = (loc)((long)lVar18 + 1);
          }
          lVar27 = (loc)((long)lVar27 + 0x100000000);
        }
        uVar1 = z_info->town_wid;
        iVar20 = 0;
        uVar4 = Rand_div((uint)(ushort)((uVar1 / 6) * 2 + 1));
        grid_01.x = (uVar4 + (uVar1 >> 1)) - z_info->town_wid / 6;
        grid_01.y = L'\0';
        uVar29 = 1;
        local_78 = grid_01;
        while( true ) {
          grid_01 = (loc)((long)grid_01 + 0x100000000);
          _Var3 = square_isfloor((chunk_conflict *)c,grid_01);
          uVar16 = (ulong)(z_info->town_hgt >> 2);
          if ((_Var3) || (uVar16 <= uVar29)) break;
          uVar29 = uVar29 + 1;
          iVar20 = iVar20 + -1;
        }
        lStackY_120 = 1;
      } while (uVar16 <= uVar29);
      wVar7 = local_78.x;
      local_60 = uVar29;
      for (iVar21 = wVar7 + L'\xffffffff'; iVar21 <= wVar7 + L'\x01'; iVar21 = iVar21 + 1) {
        iVar28 = 3;
        iVar24 = -iVar20;
        while (bVar30 = iVar28 != 0, iVar28 = iVar28 + -1, bVar30) {
          lVar18 = (loc)loc(iVar21,iVar24);
          _Var3 = square_isfiery((chunk_conflict *)c,lVar18);
          if (_Var3) {
            lVar18 = (loc)loc(iVar21,iVar24);
            square_set_feat((chunk_conflict *)c,lVar18,L'\x15');
          }
          iVar24 = iVar24 + 1;
        }
      }
      uVar1 = z_info->town_hgt;
      uVar4 = Rand_div((uint)(uVar1 >> 2));
      uVar5 = Rand_div((uint)(z_info->town_hgt >> 3));
      local_48.x = uVar5 + ((uVar1 >> 1) - uVar4);
      local_48.y = L'\0';
      uVar29 = (long)((ulong)(uint)(local_78.x >> 0x1f) << 0x20 | (ulong)local_78 & 0xffffffff) / -6
      ;
      local_68 = ((uint)z_info->town_wid - local_78.x) / 6;
      local_6c = (int)local_48.x / -4;
      local_64 = (int)(z_info->town_hgt - local_48.x) / 4;
      local_58 = (loc_conflict)((long)local_48 << 0x20 | (ulong)local_78);
      iVar20 = 0;
      local_e0 = 0;
      while (uVar16 = uVar29 & 0xffffffff, local_e0 < z_info->store_max) {
LAB_0014657a:
        bVar30 = false;
        while (iVar20 < 100 && !bVar30) {
          uVar4 = Rand_div(2);
          if (uVar4 == 0) {
            uVar4 = Rand_div(2);
            local_88.x = -(uint)(uVar4 == 0) | 1;
            local_88.y = L'\0';
            local_90.x = rand_range(local_6c,local_64);
            local_90.y = extraout_var_00;
          }
          else {
            local_88.x = rand_range((int)uVar29,local_68);
            local_88.y = extraout_var;
            uVar4 = Rand_div(2);
            local_90.x = -(uint)(uVar4 == 0) | 1;
            local_90.y = L'\0';
          }
          iVar20 = iVar20 + 1;
          if ((local_90.x != L'\0') && (local_88.x != L'\0')) {
            get_lot_bounds(local_58,(loc_conflict)
                                    ((ulong)local_88 & 0xffffffff | (long)local_90 << 0x20),
                           (wchar_t)&nw_corner,(int)&nw_corner + L'\x04',&lot_n,&local_c4,
                           (int *)CONCAT44(in_stack_fffffffffffffeec,uVar31),
                           (int *)CONCAT44(in_stack_fffffffffffffef4,uVar32));
            iVar21 = nw_corner.y;
            wVar6 = local_c4;
            wVar7 = lot_n;
            if ((lot_n - nw_corner.x < 5) || (wVar25 = nw_corner.x, local_c4 - nw_corner.y < 3))
            goto LAB_0014657a;
            for (; wVar10 = iVar21, wVar25 <= wVar7; wVar25 = wVar25 + L'\x01') {
              while (wVar10 <= wVar6) {
                grid.y = wVar10;
                grid.x = wVar25;
                _Var3 = square_isfloor((chunk_conflict *)c,grid);
                wVar10 = wVar10 + L'\x01';
                if (!_Var3) goto LAB_0014657a;
              }
            }
            bVar30 = true;
          }
        }
        if (99 < iVar20) {
          bVar30 = false;
          unaff_R13 = local_60;
          goto LAB_001462c4;
        }
        wVar7 = local_90.x;
        wVar6 = local_48.x + wVar7 * 4;
        if (local_80 <= wVar6) {
          local_80 = wVar6;
        }
        wVar25 = local_88.x;
        wVar6 = wVar25 * 6 + local_78.x;
        if (wVar6 <= local_7c) {
          local_7c = wVar6;
        }
        wVar10 = (wchar_t)local_40;
        local_40 = local_40 & 0xffffffff;
        if (wVar10 <= wVar6) {
          local_40 = (ulong)(uint)wVar6;
        }
        uVar16 = (long)local_90 << 0x20;
        get_lot_bounds(local_58,(loc_conflict)((ulong)local_88 & 0xffffffff | uVar16),
                       (wchar_t)&nw_corner,(wchar_t)&lot_n,&lot_e,&local_b8,
                       (int *)CONCAT44(in_stack_fffffffffffffeec,uVar31),
                       (int *)CONCAT44(in_stack_fffffffffffffef4,uVar32));
        wVar6 = lot_e;
        wVar23 = local_b8;
        wVar10 = nw_corner.x;
        wVar8 = lot_n;
        if ((uint)(wVar25 + L'\xfffffffe') < 0xfffffffd) {
          if (wVar7 == L'\xffffffff') {
            local_a0 = (ulong)(uint)lot_n;
            local_d8 = lot_n + L'\x01';
            uVar16 = (ulong)(uint)local_b8;
            uVar4 = Rand_div(2);
            local_98 = uVar16;
            if (local_d8 < wVar23 - uVar4) {
              uVar4 = Rand_div(2);
              local_d8 = (int)local_98 - uVar4;
            }
            local_f8 = (ulong)(uint)local_d8;
            local_e8 = (ulong)(uint)(local_d8 + L'\xfffffffe');
          }
          else {
            local_98 = (ulong)(uint)local_b8;
            uVar22 = local_b8 + L'\xffffffff';
            uVar16 = (ulong)(uint)lot_n;
            uVar4 = Rand_div(2);
            if (uVar4 + wVar8 < (int)uVar22) {
              uVar4 = Rand_div(2);
              uVar22 = uVar4 + wVar8;
            }
            local_f8 = (ulong)uVar22;
            local_d8 = uVar22 + L'\x02';
            local_e8 = local_f8;
            local_a0 = uVar16;
          }
          wVar6 = lot_e;
          local_100 = nw_corner.x;
          wVar7 = rand_range(nw_corner.x + 1,lot_e + L'\xfffffffe');
          iVar21 = wVar7 + L'\xfffffffe';
          if (wVar7 + L'\xfffffffe' < local_100) {
            iVar21 = local_100;
          }
          wVar8 = rand_range(iVar21,wVar7);
          iVar21 = (int)local_f8;
          lVar18 = (loc)loc(wVar8 + L'\xffffffff',iVar21);
          _Var3 = square_isfloor((chunk_conflict *)c,lVar18);
          wVar10 = wVar8 + L'\x01';
          wVar25 = wVar10;
          if (wVar10 < wVar7) {
            wVar25 = wVar7;
          }
          if (_Var3) {
            wVar25 = wVar7;
            wVar10 = wVar8;
          }
          local_f0 = (ulong)(uint)wVar25;
          wVar7 = wVar25 + L'\x02';
          if (wVar6 <= wVar25 + L'\x02') {
            wVar7 = wVar6;
          }
          wVar9 = rand_range(wVar10 + L'\x02',wVar7);
          iVar28 = wVar9 - wVar10;
joined_r0x00146e8f:
          if (1 < iVar28) {
            lVar18 = (loc)loc(wVar9 + L'\x01',iVar21);
            _Var3 = square_isfloor((chunk_conflict *)c,lVar18);
            if (!_Var3) {
              wVar9 = wVar9 + L'\xffffffff';
              if (wVar9 <= (wchar_t)local_f0) {
                local_f0 = (ulong)(uint)wVar9;
              }
            }
          }
        }
        else if ((uint)(wVar7 + L'\xfffffffe') < 0xfffffffd) {
          if (local_88.x == L'\xffffffff') {
            uVar22 = nw_corner.x + 1;
            uVar4 = Rand_div(2);
            uVar5 = Rand_div(2);
            if ((int)uVar22 < wVar6 - (uVar5 + uVar4)) {
              uVar4 = Rand_div(2);
              uVar5 = Rand_div(2);
              uVar22 = wVar6 - (uVar5 + uVar4);
            }
            local_f0 = (ulong)uVar22;
            local_a8 = (ulong)(uVar22 - 2);
            local_b0 = local_f0;
          }
          else {
            local_a8 = (ulong)(uint)(lot_e + L'\xffffffff');
            uVar4 = Rand_div(2);
            uVar5 = Rand_div(2);
            if (uVar5 + uVar4 + wVar10 < (int)local_a8) {
              uVar4 = Rand_div(2);
              uVar5 = Rand_div(2);
              local_a8 = (ulong)(uint)(uVar5 + uVar4 + wVar10);
            }
            local_f0 = local_a8 & 0xffffffff;
            local_b0 = (ulong)((int)local_a8 + 2);
          }
          wVar7 = lot_n;
          local_100 = wVar10;
          local_100 = wVar10;
          uVar16 = (ulong)(uint)lot_n;
          local_98 = (ulong)(uint)local_b8;
          wVar10 = rand_range(lot_n,local_b8 + L'\xffffffff');
          wVar25 = wVar10 + L'\xfffffffe';
          if (wVar10 + L'\xfffffffe' < wVar7) {
            wVar25 = wVar7;
          }
          local_a0 = uVar16;
          wVar8 = rand_range(wVar25,wVar10);
          lVar18 = (loc)loc((int)local_f0,wVar8 + L'\xffffffff');
          _Var3 = square_isfloor((chunk_conflict *)c,lVar18);
          wVar7 = wVar8 + L'\x01';
          wVar25 = wVar7;
          if (wVar7 < wVar10) {
            wVar25 = wVar10;
          }
          if (_Var3) {
            wVar7 = wVar8;
          }
          local_e8 = (ulong)(uint)wVar7;
          if (_Var3) {
            wVar25 = wVar10;
          }
          local_f8 = (ulong)(uint)wVar25;
          wVar10 = wVar7 + L'\x01';
          if (wVar7 + L'\x01' <= wVar25) {
            wVar10 = wVar25;
          }
          iVar21 = wVar25 + L'\x02';
          if ((int)local_98 < wVar25 + L'\x02') {
            iVar21 = (int)local_98;
          }
          local_d8 = rand_range(wVar10,iVar21);
          if (local_d8 - wVar7 < 2) {
            wVar10 = (wchar_t)local_a8;
            wVar9 = (wchar_t)local_b0;
          }
          else {
            lVar18 = (loc)loc((int)local_f0,local_d8 + L'\x01');
            _Var3 = square_isfloor((chunk_conflict *)c,lVar18);
            if (!_Var3) {
              local_d8 = local_d8 + L'\xffffffff';
              if (local_d8 <= wVar25) {
                local_f8 = (ulong)(uint)local_d8;
              }
            }
            wVar10 = (wchar_t)local_a8;
            wVar9 = (wchar_t)local_b0;
          }
        }
        else {
          if (local_88.x < L'\0') {
            uVar4 = Rand_div(2);
            wVar25 = ~uVar4 + wVar6;
            uVar4 = Rand_div(2);
            wVar7 = wVar6;
            if (uVar4 + wVar25 < wVar6) {
              uVar4 = Rand_div(2);
              wVar7 = uVar4 + wVar25;
            }
            local_100 = nw_corner.x;
            iVar21 = wVar25 + L'\xfffffffe';
            if (wVar25 + L'\xfffffffe' < nw_corner.x) {
              iVar21 = nw_corner.x;
            }
            wVar10 = rand_range(iVar21,wVar7 + L'\xfffffffe');
          }
          else {
            local_100 = nw_corner.x;
            uVar4 = Rand_div(2);
            iVar21 = uVar4 + wVar10;
            wVar25 = iVar21 + L'\x01';
            uVar4 = Rand_div(2);
            if (wVar10 < wVar25 - uVar4) {
              uVar4 = Rand_div(2);
              wVar10 = wVar25 - uVar4;
            }
            wVar6 = lot_e;
            wVar7 = iVar21 + L'\x03';
            if (lot_e < wVar7) {
              wVar7 = lot_e;
            }
            wVar7 = rand_range(wVar10 + L'\x02',wVar7);
          }
          wVar23 = local_b8;
          wVar8 = lot_n;
          local_a8 = (ulong)(uint)wVar10;
          local_f0 = (ulong)(uint)wVar25;
          local_b0 = (ulong)(uint)wVar7;
          if ((long)uVar16 < 0) {
            uVar16 = (ulong)(uint)local_b8;
            uVar4 = Rand_div(2);
            wVar23 = wVar23 - uVar4;
            local_f8 = (ulong)(uint)wVar23;
            local_98 = uVar16;
            local_d8 = wVar23;
            if (wVar10 == wVar25 || wVar7 == wVar25) {
              uVar4 = Rand_div(2);
              local_d8 = uVar4 + wVar23;
            }
            local_a0 = (ulong)(uint)lot_n;
            wVar7 = wVar23 + L'\xfffffffe';
            if (wVar23 + L'\xfffffffe' < lot_n) {
              wVar7 = lot_n;
            }
            local_e8 = (ulong)(uint)wVar7;
            wVar10 = (wchar_t)local_a8;
            if (local_d8 - wVar7 < 2) goto LAB_00146d25;
            lVar18 = (loc)loc(wVar25,wVar7 + L'\xffffffff');
            _Var3 = square_isfloor((chunk_conflict *)c,lVar18);
            wVar9 = (wchar_t)local_b0;
            if (!_Var3) {
              wVar7 = wVar7 + L'\x01';
              local_e8 = (ulong)(uint)wVar7;
              if (wVar23 < wVar7) {
                local_f8 = (ulong)(uint)wVar7;
              }
            }
          }
          else {
            uVar16 = (ulong)(uint)lot_n;
            uVar4 = Rand_div(2);
            wVar8 = uVar4 + wVar8;
            local_f8 = (ulong)(uint)wVar8;
            local_e8 = local_f8;
            if (wVar10 == wVar25 || wVar7 == wVar25) {
              uVar4 = Rand_div(2);
              local_e8 = (ulong)(uint)(wVar8 - uVar4);
            }
            local_98 = (ulong)(uint)local_b8;
            local_d8 = wVar8 + L'\x02';
            if (local_b8 < wVar8 + L'\x02') {
              local_d8 = local_b8;
            }
            wVar10 = (wchar_t)local_a8;
            local_a0 = uVar16;
            if (local_d8 - (int)local_e8 < 2) {
LAB_00146d25:
              wVar9 = (wchar_t)local_b0;
            }
            else {
              lVar18 = (loc)loc(wVar25,local_d8 + L'\x01');
              _Var3 = square_isfloor((chunk_conflict *)c,lVar18);
              wVar9 = (wchar_t)local_b0;
              if ((!_Var3) && (local_d8 = local_d8 + L'\xffffffff', local_d8 < wVar8)) {
                local_f8 = (ulong)(uint)local_d8;
              }
            }
          }
          iVar28 = wVar9 - wVar10;
          iVar21 = (int)local_f8;
          if ((local_88.x < L'\0') && (1 < iVar28)) {
            lVar18 = (loc)loc(wVar10 + L'\xffffffff',iVar21);
            _Var3 = square_isfloor((chunk_conflict *)c,lVar18);
            if (!_Var3) {
              wVar10 = wVar10 + L'\x01';
              if (wVar25 <= wVar10) {
                local_f0 = (ulong)(uint)wVar10;
              }
            }
          }
          else if (L'\0' < local_88.x) goto joined_r0x00146e8f;
        }
        if (local_100 < wVar10) {
          local_100 = wVar10;
        }
        if (wVar9 < wVar6) {
          wVar6 = wVar9;
        }
        uVar16 = local_a0;
        if ((int)local_a0 < (int)local_e8) {
          uVar16 = local_e8;
        }
        wVar7 = (wchar_t)local_98;
        if (local_d8 < (wchar_t)local_98) {
          wVar7 = local_d8;
        }
        uVar31 = 0;
        fill_rectangle(c,(wchar_t)uVar16,local_100,wVar7,wVar6,L'\x16',L'\0');
        local_e0 = local_e0 + 1;
        lVar19 = 0x21;
        for (lVar26 = 0; lVar26 != 0x19; lVar26 = lVar26 + 1) {
          _Var3 = feat_is_shop((wchar_t)lVar26);
          if ((_Var3) && (local_e0 == f_info->flags[lVar19 + -0x23])) {
            square_set_feat((chunk_conflict *)c,(loc)(local_f0 | local_f8 << 0x20),(wchar_t)lVar26);
          }
          lVar19 = lVar19 + 0x70;
        }
      }
      unaff_R13 = local_60;
      if (iVar20 < 100) {
        while (iVar20 = (int)uVar16, iVar20 <= local_68) {
          iVar21 = local_6c;
          if (iVar20 != 0) {
            for (; iVar21 <= local_64; iVar21 = iVar21 + 1) {
              if (((iVar21 != 0) && (uVar4 = Rand_div(100), (int)uVar4 < 0x51)) &&
                 (uVar4 = Rand_div(2), uVar4 == 0)) {
                lVar17 = loc(iVar20,iVar21);
                get_lot_bounds(local_58,lVar17,(wchar_t)&nw_corner,(int)&nw_corner + L'\x04',&lot_n,
                               &local_c4,(int *)CONCAT44(in_stack_fffffffffffffeec,uVar31),
                               (int *)CONCAT44(in_stack_fffffffffffffef4,uVar32));
                iVar28 = nw_corner.y;
                wVar6 = local_c4;
                wVar7 = lot_n;
                for (wVar25 = nw_corner.x; wVar10 = iVar28, wVar25 <= wVar7;
                    wVar25 = wVar25 + L'\x01') {
                  while (wVar10 <= wVar6) {
                    grid_00.y = wVar10;
                    grid_00.x = wVar25;
                    psVar15 = square((chunk_conflict *)c,grid_00);
                    _Var3 = feat_is_shop((uint)psVar15->feat);
                    unaff_R13 = local_60;
                    wVar10 = wVar10 + L'\x01';
                    if (_Var3) goto LAB_0014727c;
                  }
                }
                lVar17 = loc(iVar20,iVar21);
                get_lot_bounds(local_58,lVar17,(wchar_t)&nw_corner,(wchar_t)&lot_n,&lot_e,&local_b8,
                               (int *)CONCAT44(in_stack_fffffffffffffeec,uVar31),
                               (int *)CONCAT44(in_stack_fffffffffffffef4,uVar32));
                wVar6 = local_b8;
                iVar28 = nw_corner.x;
                wVar7 = lot_n;
                local_a0 = CONCAT44(local_a0._4_4_,lot_e);
                unaff_R13 = local_60;
                if ((nw_corner.x < lot_e) && (lot_n < local_b8)) {
                  iVar24 = rand_range(1,4);
                  iVar11 = rand_range(1,2);
                  iVar12 = rand_range(1,5 - iVar24);
                  iVar13 = rand_range(1,3 - iVar11);
                  wVar10 = iVar13 + iVar11 + wVar6 + L'\xfffffffc';
                  local_38 = iVar12 + iVar24 + (wchar_t)local_a0 + L'\xfffffffa';
                  uVar31 = 0;
                  local_b0 = CONCAT44(local_b0._4_4_,iVar12 + iVar28);
                  fill_rectangle(c,iVar13 + wVar7,iVar12 + iVar28,wVar10,local_38,L'\x15',L'\0');
                  wVar25 = iVar28;
                  while (wVar8 = wVar25, unaff_R13 = local_60, wVar8 <= (wchar_t)local_a0) {
                    bVar30 = wVar8 < (wchar_t)local_b0;
                    bVar2 = local_38 < wVar8;
                    local_98 = CONCAT71(local_98._1_7_,wVar8 == L'\x02' || iVar28 < wVar8);
                    local_a8 = CONCAT44(local_a8._4_4_,wVar8 + L'\xffffffff');
                    for (wVar23 = wVar7; wVar25 = wVar8 + L'\x01', wVar23 <= wVar6;
                        wVar23 = wVar23 + L'\x01') {
                      if ((wVar10 < wVar23) || (wVar23 < iVar13 + wVar7 || (bVar2 || bVar30))) {
                        uVar4 = Rand_div(3);
                        if (uVar4 == 0) {
                          lVar18 = (loc)loc(wVar8,wVar23);
                          _Var3 = square_isfloor((chunk_conflict *)c,lVar18);
                          if (_Var3) {
                            if ((char)local_98 == '\0') {
                              lVar18 = (loc)loc((int)local_a8,wVar23);
                              _Var3 = square_isperm((chunk_conflict *)c,lVar18);
                              if (_Var3) goto LAB_00147251;
                            }
                            if (((wchar_t)local_a0 <= wVar8) &&
                               (wVar8 != (uint)z_info->town_wid + L'\xfffffffe')) {
                              lVar18 = (loc)loc(wVar8 + L'\x01',wVar23);
                              _Var3 = square_isperm((chunk_conflict *)c,lVar18);
                              if (_Var3) goto LAB_00147251;
                            }
                            if (wVar23 != L'\x02' && wVar23 <= wVar7) {
                              lVar18 = (loc)loc(wVar8,wVar23 + L'\xffffffff');
                              _Var3 = square_isperm((chunk_conflict *)c,lVar18);
                              if (_Var3) goto LAB_00147251;
                            }
                            wVar25 = L'\x18';
                            if ((wVar6 <= wVar23) &&
                               (wVar23 != (uint)z_info->town_hgt + L'\xfffffffe')) {
                              lVar18 = (loc)loc(wVar8,wVar23 + L'\x01');
                              _Var3 = square_isperm((chunk_conflict *)c,lVar18);
                              wVar25 = L'\x18';
                              if (_Var3) goto LAB_00147251;
                            }
LAB_00147117:
                            lVar18 = (loc)loc(wVar8,wVar23);
                            square_set_feat((chunk_conflict *)c,lVar18,wVar25);
                          }
                        }
                      }
                      else {
                        uVar4 = Rand_div(4);
                        wVar25 = L'\x10';
                        if (uVar4 == 0) goto LAB_00147117;
                      }
LAB_00147251:
                    }
                  }
                }
              }
LAB_0014727c:
            }
          }
          uVar16 = (ulong)(iVar20 + 1);
        }
        bVar30 = true;
      }
      else {
        bVar30 = false;
      }
      goto LAB_001462c4;
    }
    wVar7 = local_78.x;
    lVar27 = (loc)loc(wVar7,(int)unaff_R13 + 1);
    square_set_feat((chunk_conflict *)c,lVar27,L'\x01');
    fill_rectangle(c,(int)unaff_R13 + L'\x02',wVar7 + L'\xffffffff',local_80,wVar7 + L'\x01',L'\x01'
                   ,L'\0');
    fill_rectangle(c,local_48.x,local_7c,local_48.x + L'\x01',(wchar_t)local_40,L'\x01',L'\0');
    lVar18 = (loc)((ulong)lVar18 & 0xffffffff | unaff_R13 << 0x20);
    square_set_feat((chunk_conflict *)c,lVar18,L'\x06');
  }
  else {
    c->depth = source->depth;
    _Var3 = chunk_copy((chunk_conflict *)c,p,source,L'\0',L'\0',L'\0',false);
    if (!_Var3) {
      quit_fmt("chunk_copy() level bounds failed!");
    }
    chunk_list_remove("Town");
    cave_free(source);
    lVar26 = 0;
    uVar29 = 0;
    for (lVar19 = 0; lVar19 < c->height; lVar19 = lVar19 + 1) {
      for (uVar29 = 0; (long)uVar29 < (long)c->width; uVar29 = uVar29 + 1) {
        pfVar14 = square_feat((chunk_conflict *)c,(loc)(lVar26 + uVar29));
        if (pfVar14->fidx == L'\x06') goto LAB_0014620d;
      }
      lVar26 = lVar26 + 0x100000000;
    }
LAB_0014620d:
    lVar18 = (loc)(uVar29 & 0xffffffff | lVar19 << 0x20);
  }
  player_place((chunk_conflict2 *)c,local_50,(loc_conflict)lVar18);
  _Var3 = is_daytime();
  cave_illuminate(c,_Var3);
  while (bVar30 = local_70 != 0, local_70 = local_70 - 1, bVar30) {
    pick_and_place_distant_monster(c,local_50->grid,L'\x03',true,c->depth);
  }
  return (chunk_conflict *)c;
}

Assistant:

struct chunk *town_gen(struct player *p, int min_height, int min_width,
		const char **p_error)
{
	int i;
	struct loc grid;
	int residents = is_daytime() ? z_info->town_monsters_day :
		z_info->town_monsters_night;
	struct chunk *c_new, *c_old = chunk_find_name("Town");

	/* Make a new chunk */
	c_new = cave_new(z_info->town_hgt, z_info->town_wid);

	/* First time */
	if (!c_old) {
		c_new->depth = p->depth;

		/* Build stuff */
		town_gen_layout(c_new, p);
	} else {
		/* Copy from the chunk list, remove the old one */
		c_new->depth = c_old->depth;
		if (!chunk_copy(c_new, p, c_old, 0, 0, 0, 0))
			quit_fmt("chunk_copy() level bounds failed!");
		chunk_list_remove("Town");
		cave_free(c_old);

		/* Find the stairs (lame) */
		for (grid.y = 0; grid.y < c_new->height; grid.y++) {
			bool found = false;
			for (grid.x = 0; grid.x < c_new->width; grid.x++) {
				if (square_feat(c_new, grid)->fidx == FEAT_MORE) {
					found = true;
					break;
				}
			}
			if (found) break;
		}

		/* Place the player */
		player_place(c_new, p, grid);
	}

	/* Apply illumination */
	cave_illuminate(c_new, is_daytime());

	/* Make some residents */
	for (i = 0; i < residents; i++) {
		pick_and_place_distant_monster(c_new, p->grid, 3, true,
			c_new->depth);
	}

	return c_new;
}